

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::RsProdSyntax*>::emplace_back<slang::syntax::RsProdSyntax*>
          (SmallVectorBase<slang::syntax::RsProdSyntax*> *this,RsProdSyntax **args)

{
  long lVar1;
  reference ppRVar2;
  pointer ppRVar3;
  
  lVar1 = *(long *)(this + 8);
  ppRVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppRVar3 = emplaceRealloc<slang::syntax::RsProdSyntax*>(this,ppRVar3,args);
    return ppRVar3;
  }
  *ppRVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppRVar2 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::back
                      ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
  return ppRVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }